

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O2

void Cnf_CutAssignAreaFlow(Cnf_Man_t *p,Dar_Cut_t *pCut,int *pAreaFlows)

{
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  uint uVar4;
  
  uVar1 = *(uint *)&pCut->field_0x4;
  uVar4 = uVar1 & 0xf800ffff;
  *(uint *)&pCut->field_0x4 = uVar4;
  uVar2 = (ulong)uVar1 & 0xffff;
  pCut->uSign = ((int)p->pSopSizes[uVar2 ^ 0xffff] + (int)p->pSopSizes[uVar2]) * 10;
  uVar2 = 0;
  do {
    if (uVar4 >> 0x1d <= uVar2) {
      return;
    }
    pvVar3 = Vec_PtrEntry(p->pManAig->vObjs,pCut->pLeaves[uVar2]);
    uVar4 = *(uint *)&pCut->field_0x4 & 0xf800ffff |
            (*(uint *)((long)pvVar3 + 0x18) & 0x1ffc0) * 0x400 + *(uint *)&pCut->field_0x4 &
            0x7ff0000;
    *(uint *)&pCut->field_0x4 = uVar4;
    uVar1 = *(uint *)((long)pvVar3 + 0x18);
    if (0xfffffffd < (uVar1 & 7) - 7) {
      if (uVar1 < 0x40) {
        __assert_fail("pLeaf->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMap.c"
                      ,0x39,"void Cnf_CutAssignAreaFlow(Cnf_Man_t *, Dar_Cut_t *, int *)");
      }
      pCut->uSign = pCut->uSign + pAreaFlows[*(int *)((long)pvVar3 + 0x24)] / (int)(uVar1 >> 6);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area flow of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CutAssignAreaFlow( Cnf_Man_t * p, Dar_Cut_t * pCut, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i;
    pCut->Value = 0;
//    pCut->uSign = 100 * Cnf_CutSopCost( p, pCut );
    pCut->uSign = 10 * Cnf_CutSopCost( p, pCut );
    Dar_CutForEachLeaf( p->pManAig, pCut, pLeaf, i )
    {
        pCut->Value += pLeaf->nRefs;
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        pCut->uSign += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
}